

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalSubtractOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  int iVar1;
  short params;
  short params_1;
  unsigned_long *puVar2;
  bool bVar3;
  OutOfRangeException *this;
  short sVar4;
  string local_48;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) ||
     ((puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 != (unsigned_long *)0x0 && ((*puVar2 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  params = *(short *)left->data;
  params_1 = *(short *)right->data;
  if (params_1 < 0) {
    iVar1 = params_1 + 9999;
    if (params <= iVar1) goto LAB_010a6397;
  }
  else {
    iVar1 = params_1 + -9999;
    if (iVar1 <= params) {
LAB_010a6397:
      sVar4 = params - params_1;
      bVar3 = true;
      goto LAB_010a639e;
    }
  }
  sVar4 = (short)iVar1;
  bVar3 = false;
LAB_010a639e:
  if (bVar3) {
    *(short *)result->data = sVar4;
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an explicit cast to a bigger decimal."
             ,"");
  OutOfRangeException::OutOfRangeException<short,short>(this,&local_48,params,params_1);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}